

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O3

char * LZ4_slideInputBuffer(void *LZ4_Data)

{
  uint uVar1;
  void *__dest;
  uint uVar2;
  ulong __n;
  
  uVar1 = *(uint *)((long)LZ4_Data + 0x4018);
  uVar2 = 0x10000;
  if (uVar1 < 0x10000) {
    uVar2 = uVar1;
  }
  __n = (ulong)uVar2;
  __dest = *(void **)((long)LZ4_Data + 0x4010);
  memmove(__dest,(void *)(((ulong)uVar1 + *(long *)((long)LZ4_Data + 0x4008)) - __n),__n);
  *(void **)((long)LZ4_Data + 0x4008) = __dest;
  *(uint *)((long)LZ4_Data + 0x4018) = uVar2;
  return (char *)(*(long *)((long)LZ4_Data + 0x4010) + __n);
}

Assistant:

char* LZ4_slideInputBuffer (void* LZ4_Data)
{
    LZ4_stream_t_internal* ctx = (LZ4_stream_t_internal*)LZ4_Data;
    int dictSize = LZ4_saveDict((LZ4_stream_t*)LZ4_Data, (char*)ctx->bufferStart, 64 KB);
    return (char*)(ctx->bufferStart + dictSize);
}